

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search.cpp
# Opt level: O3

SearchResult *
search::search(SearchResult *__return_storage_ptr__,Position *pos,SearchGlobals *sg,int depth)

{
  long lVar1;
  int *piVar2;
  array<search::SearchStack,_128UL> search_stack;
  undefined1 auStack_a30 [8];
  SearchStack local_a28 [128];
  
  memset(local_a28,0,0xa00);
  lVar1 = 0xc;
  do {
    auStack_a30[lVar1] = 0;
    *(undefined1 *)
     ((long)&local_a28[0].killer_moves._M_elems[0].super__Optional_base<libchess::Move,_true,_true>.
             _M_payload.super__Optional_payload_base<libchess::Move>._M_payload + lVar1) = 0;
    lVar1 = lVar1 + 0x14;
  } while (lVar1 != 0xa0c);
  piVar2 = &local_a28[0].ply;
  lVar1 = 0;
  do {
    *piVar2 = (int)lVar1;
    *(bool *)(piVar2 + -3) = false;
    *(bool *)(piVar2 + -1) = false;
    lVar1 = lVar1 + 1;
    piVar2 = piVar2 + 5;
  } while (lVar1 != 0x80);
  search_impl(__return_storage_ptr__,pos,-0x7531,0x7531,depth,local_a28,sg);
  return __return_storage_ptr__;
}

Assistant:

SearchResult search(Position& pos, SearchGlobals& sg, int depth) {
    auto search_stack = SearchStack::new_search_stack();
    int alpha = -INFINITE;
    int beta = +INFINITE;
    SearchResult search_result = search_impl(pos, alpha, beta, depth, search_stack.begin(), sg);
    return search_result;
}